

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O1

int Io_ReadPlaMergeDistance1(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  ulong *puVar1;
  word *pwVar2;
  word *pwVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  size_t __size;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int local_60;
  
  iVar10 = nCubes >> 5;
  if (vMarks->nCap < nCubes) {
    iVar11 = (iVar10 + 1) - (uint)((nCubes & 0x1fU) == 0);
    __size = (long)iVar11 << 2;
    if (vMarks->pArray == (int *)0x0) {
      piVar7 = (int *)malloc(__size);
    }
    else {
      piVar7 = (int *)realloc(vMarks->pArray,__size);
    }
    vMarks->pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                    ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
    }
    vMarks->nCap = iVar11 * 0x20;
  }
  uVar12 = (uint)((nCubes & 0x1fU) != 0);
  iVar11 = uVar12 + iVar10;
  if (iVar11 != 0 && SCARRY4(uVar12,iVar10) == iVar11 < 0) {
    memset(vMarks->pArray,0,(ulong)(iVar11 - 1) * 4 + 4);
  }
  vMarks->nSize = iVar11 * 0x20;
  if (nCubes < 1) {
    local_60 = 0;
  }
  else {
    uVar9 = (ulong)(uint)nCubes;
    uVar17 = 1;
    local_60 = 0;
    uVar8 = 0;
    do {
      if ((long)vMarks->nSize <= (long)uVar8) {
LAB_002d3f52:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      piVar7 = vMarks->pArray;
      uVar15 = uVar8 + 1;
      if (uVar15 < uVar9 && ((uint)piVar7[uVar8 >> 5 & 0x7ffffff] >> ((uint)uVar8 & 0x1f) & 1) == 0)
      {
        uVar18 = uVar17;
LAB_002d3e5c:
        if (uVar18 != (uint)vMarks->nSize) {
          uVar13 = uVar18 >> 5 & 0x7ffffff;
          uVar12 = piVar7[uVar13];
          uVar19 = (uint)uVar18 & 0x1f;
          if (((uVar12 >> uVar19 & 1) != 0) || (nWords < 1)) goto LAB_002d3ee6;
          pwVar2 = pCs[uVar8];
          pwVar3 = pCs[uVar18];
          uVar16 = 0;
          bVar5 = false;
          do {
            uVar4 = pwVar2[uVar16];
            uVar14 = pwVar3[uVar16];
            if ((uVar4 != uVar14) &&
               ((bVar6 = false, bVar5 ||
                (uVar14 = uVar14 ^ uVar4, uVar14 = (uVar14 >> 1 | uVar14) & 0x5555555555555555,
                uVar4 = uVar14 - 1, bVar5 = true, (uVar14 ^ uVar4) <= uVar4)))) break;
            uVar16 = uVar16 + 1;
            bVar6 = bVar5;
          } while ((uint)nWords != uVar16);
          if (!bVar6) goto LAB_002d3ee6;
          if (0 < nWords) {
            uVar8 = 0;
            do {
              puVar1 = pwVar2 + uVar8;
              *puVar1 = *puVar1 & pwVar3[uVar8];
              uVar8 = uVar8 + 1;
            } while ((uint)nWords != uVar8);
          }
          piVar7[uVar13] = uVar12 | 1 << uVar19;
          local_60 = local_60 + 1;
          goto LAB_002d3f01;
        }
        goto LAB_002d3f52;
      }
LAB_002d3f01:
      uVar17 = uVar17 + 1;
      uVar8 = uVar15;
    } while (uVar15 != uVar9);
  }
  return local_60;
LAB_002d3ee6:
  uVar18 = uVar18 + 1;
  if (uVar18 == uVar9) goto LAB_002d3f01;
  goto LAB_002d3e5c;
}

Assistant:

int Io_ReadPlaMergeDistance1( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2, Res, Counter = 0;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                {
                    Res = Io_ReadPlaDistance1( pCs[c1], pCs[c2], nWords );
                    if ( !Res )
                        continue;
                    Abc_TtAnd( pCs[c1], pCs[c1], pCs[c2], nWords, 0 );
                    Vec_BitWriteEntry( vMarks, c2, 1 );
                    Counter++;
                    break;
                }
    return Counter;
}